

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O3

shared_ptr<mir::inst::Value> __thiscall
front::irGenerator::irGenerator::rightValueToValue(irGenerator *this,RightVal *rightValue)

{
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  LabelId LVar3;
  Value *pVVar4;
  variant_alternative_t<0UL,_variant<int,_int,_basic_string<char>_>_> *pvVar5;
  variant_alternative_t<2UL,_variant<int,_int,_basic_string<char>_>_> *pvVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<mir::inst::Value> sVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  string local_48;
  
  (this->_package).super_Displayable._vptr_Displayable = (_func_int **)0x0;
  *(undefined8 *)&(this->_package).functions._M_t._M_impl = 0;
  if (*(__index_type *)&in_RDX._M_pi[2]._vptr__Sp_counted_base == '\x02') {
    pVVar4 = (Value *)operator_new(0x20);
    pvVar6 = std::get<2ul,int,int,std::__cxx11::string>
                       ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_RDX._M_pi);
    pcVar1 = (pvVar6->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + pvVar6->_M_string_length);
    LVar3 = nameToLabelId((irGenerator *)rightValue,&local_48);
    *(undefined ***)&pVVar4->field_0x8 = &PTR_display_001eb100;
    *(LabelId *)&pVVar4->field_0x10 = LVar3;
    pVVar4->field_0x18 = 1;
    (pVVar4->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ecf98;
    pVVar4->shift = Lsl;
    pVVar4->shift_amount = '\0';
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::Value*>
              (&_Stack_50,pVVar4);
    _Var2._M_pi = _Stack_50._M_pi;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->_package).super_Displayable._vptr_Displayable = (_func_int **)pVVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->_package).functions._M_t._M_impl =
         _Var2._M_pi;
    in_RDX._M_pi = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      in_RDX._M_pi = extraout_RDX_01;
    }
  }
  else if (*(__index_type *)&in_RDX._M_pi[2]._vptr__Sp_counted_base == '\0') {
    pVVar4 = (Value *)operator_new(0x20);
    pvVar5 = std::get<0ul,int,int,std::__cxx11::string>
                       ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_RDX._M_pi);
    *(variant_alternative_t<0UL,_variant<int,_int,_basic_string<char>_>_> *)&pVVar4->field_0x8 =
         *pvVar5;
    pVVar4->field_0x18 = 0;
    (pVVar4->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ecf98;
    pVVar4->shift = Lsl;
    pVVar4->shift_amount = '\0';
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::Value*>
              (&_Stack_50,pVVar4);
    (this->_package).super_Displayable._vptr_Displayable = (_func_int **)pVVar4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->_package).functions._M_t._M_impl =
         _Stack_50._M_pi;
    in_RDX._M_pi = extraout_RDX;
  }
  sVar7.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar7.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mir::inst::Value>)
         sVar7.super___shared_ptr<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Value> irGenerator::rightValueToValue(RightVal &rightValue) {
  shared_ptr<Value> value;

  switch (rightValue.index()) {
    case 0:
      value = shared_ptr<Value>(new Value(get<0>(rightValue)));
      break;
    case 2: {
      value = shared_ptr<Value>(
          new Value(VarId(nameToLabelId(get<2>(rightValue)))));
    } break;
    default:
      break;
  }

  return value;
}